

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O0

uint ** Extra_TruthElementary(int nVars)

{
  int nRows;
  uint **ppuVar1;
  uint local_20;
  int nWords;
  int k;
  int i;
  uint **pRes;
  int nVars_local;
  
  nRows = Extra_TruthWordNum(nVars);
  ppuVar1 = (uint **)Extra_ArrayAlloc(nVars,nRows,4);
  for (nWords = 0; nWords < nVars; nWords = nWords + 1) {
    if (nWords < 5) {
      for (local_20 = 0; (int)local_20 < nRows; local_20 = local_20 + 1) {
        ppuVar1[nWords][(int)local_20] = s_VarMasks[nWords][1];
      }
    }
    else {
      for (local_20 = 0; (int)local_20 < nRows; local_20 = local_20 + 1) {
        if ((local_20 & 1 << ((char)nWords - 5U & 0x1f)) == 0) {
          ppuVar1[nWords][(int)local_20] = 0;
        }
        else {
          ppuVar1[nWords][(int)local_20] = 0xffffffff;
        }
      }
    }
  }
  return ppuVar1;
}

Assistant:

unsigned ** Extra_TruthElementary( int nVars )
{
    unsigned ** pRes;
    int i, k, nWords;
    nWords = Extra_TruthWordNum(nVars);
    pRes = (unsigned **)Extra_ArrayAlloc( nVars, nWords, 4 );
    for ( i = 0; i < nVars; i++ )
    {
        if ( i < 5 )
        {
            for ( k = 0; k < nWords; k++ )
                pRes[i][k] = s_VarMasks[i][1];
        }
        else
        {
            for ( k = 0; k < nWords; k++ )
                if ( k & (1 << (i-5)) )
                    pRes[i][k] = ~(unsigned)0;
                else
                    pRes[i][k] = 0;
        }
    }
    return pRes;
}